

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

vector<CService,_std::allocator<CService>_> *
Lookup(vector<CService,_std::allocator<CService>_> *__return_storage_ptr__,string *name,
      uint16_t portDefault,bool fAllowLookup,uint nMaxSolutions,DNSLookupFn dns_lookup_function)

{
  size_type sVar1;
  char *pcVar2;
  size_type sVar3;
  size_type sVar4;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_R9;
  CNetAddr *addr;
  pointer __args;
  long in_FS_OFFSET;
  string_view in;
  uint16_t port;
  string hostname;
  _Any_data _Stack_98;
  code *local_88;
  vector<CNetAddr,_std::allocator<CNetAddr>_> local_78;
  uint16_t local_5a;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = name->_M_string_length;
  if ((sVar1 != 0) && (pcVar2 = (name->_M_dataplus)._M_p, *pcVar2 != '\0')) {
    sVar3 = 1;
    do {
      sVar4 = sVar3;
      if (sVar1 == sVar4) goto LAB_006adbe8;
      sVar3 = sVar4 + 1;
    } while (pcVar2[sVar4] != '\0');
    if (sVar1 == sVar4) {
LAB_006adbe8:
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      in._M_str = pcVar2;
      in._M_len = sVar1;
      local_5a = portDefault;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      SplitHostPort(in,&local_5a,&local_58);
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)&_Stack_98,in_R9);
      LookupIntern(&local_78,&local_58,nMaxSolutions,fAllowLookup,(DNSLookupFn *)&_Stack_98);
      if (local_88 != (code *)0x0) {
        (*local_88)(&_Stack_98,&_Stack_98,__destroy_functor);
      }
      (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (std::vector<CService,_std::allocator<CService>_>::reserve
                    (__return_storage_ptr__,
                     (long)local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                           super__Vector_impl_data._M_start >> 5),
         local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        __args = local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          std::vector<CService,std::allocator<CService>>::
          emplace_back<CNetAddr_const&,unsigned_short&>
                    ((vector<CService,std::allocator<CService>> *)__return_storage_ptr__,__args,
                     &local_5a);
          __args = __args + 1;
        } while (__args != local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_006add7c;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
LAB_006add7c:
  __stack_chk_fail();
}

Assistant:

std::vector<CService> Lookup(const std::string& name, uint16_t portDefault, bool fAllowLookup, unsigned int nMaxSolutions, DNSLookupFn dns_lookup_function)
{
    if (name.empty() || !ContainsNoNUL(name)) {
        return {};
    }
    uint16_t port{portDefault};
    std::string hostname;
    SplitHostPort(name, port, hostname);

    const std::vector<CNetAddr> addresses{LookupIntern(hostname, nMaxSolutions, fAllowLookup, dns_lookup_function)};
    if (addresses.empty()) return {};
    std::vector<CService> services;
    services.reserve(addresses.size());
    for (const auto& addr : addresses)
        services.emplace_back(addr, port);
    return services;
}